

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O0

void modifyChannels<Imath_3_2::half>
               (list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                *channels,half delta)

{
  bool bVar1;
  reference this;
  half *this_00;
  long lVar2;
  int x;
  int y;
  Array2D<Imath_3_2::half> *channel;
  iterator i;
  list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
  *in_stack_ffffffffffffffa8;
  _Self in_stack_ffffffffffffffc0;
  int local_30;
  int local_2c;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) break;
    this = std::_List_iterator<Imf_3_4::Array2D<Imath_3_2::half>_>::operator*
                     ((_List_iterator<Imf_3_4::Array2D<Imath_3_2::half>_> *)0x119d11);
    local_2c = 0;
    while( true ) {
      this_00 = (half *)(long)local_2c;
      lVar2 = Imf_3_4::Array2D<Imath_3_2::half>::height(this);
      if (lVar2 <= (long)this_00) break;
      local_30 = 0;
      while( true ) {
        lVar2 = Imf_3_4::Array2D<Imath_3_2::half>::width(this);
        if (lVar2 <= local_30) break;
        Imf_3_4::Array2D<Imath_3_2::half>::operator[](this,(long)local_2c);
        Imath_3_2::half::operator+=
                  (this_00,(half)(uint16_t)((ulong)in_stack_ffffffffffffffc0._M_node >> 0x30));
        local_30 = local_30 + 1;
      }
      local_2c = local_2c + 1;
    }
    in_stack_ffffffffffffffc0 =
         std::_List_iterator<Imf_3_4::Array2D<Imath_3_2::half>_>::operator++(local_18,0);
  }
  return;
}

Assistant:

void
modifyChannels (list<Array2D<T>>& channels, T delta)
{
    //
    // Dummy code modifying each pixel by incrementing every channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                channel[y][x] += delta;
            }
        }
    }
}